

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_nivplot.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  ImFontAtlas *this;
  bool bVar2;
  int iVar3;
  ImGuiIO *pIVar4;
  ImWchar *glyph_ranges;
  ImGuiStyle *pIVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  thread thd;
  thread local_48;
  char **local_40;
  reference_wrapper<nivalis::Plotter> local_38;
  
  local_40 = argv;
  if (1 < argc) {
    uVar8 = 1;
    lVar6 = 0x50;
    do {
      if (1 < uVar8) {
        nivalis::Plotter::add_func((Plotter *)(anonymous_namespace)::plot);
      }
      __s = local_40[uVar8];
      pcVar1 = *(char **)((anonymous_namespace)::plot._64_8_ + 8 + lVar6);
      uVar7 = (anonymous_namespace)::plot._64_8_ + lVar6;
      strlen(__s);
      std::__cxx11::string::_M_replace(uVar7,0,pcVar1,(ulong)__s);
      nivalis::Plotter::reparse_expr((Plotter *)(anonymous_namespace)::plot,uVar8 - 1);
      lVar6 = lVar6 + 0x130;
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)argc);
  }
  iVar3 = 1;
  bVar2 = init_gl();
  if (bVar2) {
    ImGui::DebugCheckVersionAndDataLayout("1.75 WIP",0x1550,0x3d0,8,0x10,0x14,4);
    ImGui::CreateContext((ImFontAtlas *)0x0);
    pIVar4 = ImGui::GetIO();
    this = pIVar4->Fonts;
    glyph_ranges = nivalis::GetGlyphRangesGreek();
    (anonymous_namespace)::font_sm =
         ImFontAtlas::AddFontFromMemoryCompressedTTF
                   (this,ROBOTO_compressed_data,0x18ee3,16.0,(ImFontConfig *)0x0,glyph_ranges);
    (anonymous_namespace)::font_md =
         ImFontAtlas::AddFontFromMemoryCompressedTTF
                   (pIVar4->Fonts,ROBOTO_compressed_data,0x18ee3,18.0,(ImFontConfig *)0x0,
                    (ImWchar *)0x0);
    ImGui_ImplGlfw_InitForOpenGL((anonymous_namespace)::window,true);
    ImGui_ImplOpenGL3_Init((char *)0x0);
    ImGui::StyleColorsLight((ImGuiStyle *)0x0);
    pIVar5 = ImGui::GetStyle();
    pIVar5->WindowRounding = 0.0;
    pIVar5->WindowBorderSize = 1.0;
    pIVar5->FrameBorderSize = 0.0;
    pIVar5->Colors[5].x = 0.8;
    pIVar5->Colors[5].y = 0.8;
    pIVar5->Colors[5].z = 0.8;
    pIVar5->Colors[5].w = 1.0;
    pIVar5->Colors[6].x = 0.0;
    pIVar5->Colors[6].y = 0.0;
    pIVar5->Colors[6].z = 0.0;
    pIVar5->Colors[6].w = 0.0;
    pIVar5->Colors[10].x = 0.75;
    pIVar5->Colors[10].y = 0.75;
    pIVar5->Colors[10].z = 0.75;
    pIVar5->Colors[10].w = 1.0;
    *(undefined8 *)(pIVar5->Colors + 0xb) = 0x3f3333333f333333;
    pIVar5->Colors[0xb].z = 0.7;
    pIVar5->Colors[0xb].w = 1.0;
    pIVar5->Colors[0xc].x = 0.75;
    pIVar5->Colors[0xc].y = 0.75;
    pIVar5->Colors[0xc].z = 0.75;
    pIVar5->Colors[0xc].w = 1.0;
    pIVar5->Colors[2].x = 0.99;
    pIVar5->Colors[2].y = 0.99;
    pIVar5->Colors[2].z = 0.99;
    pIVar5->Colors[2].w = 1.0;
    pIVar5->Colors[7].x = 0.94;
    pIVar5->Colors[7].y = 0.94;
    pIVar5->Colors[7].z = 0.94;
    pIVar5->Colors[7].w = 1.0;
    local_38._M_data = (Plotter *)(anonymous_namespace)::plot;
    std::thread::thread<void(&)(nivalis::Plotter&),std::reference_wrapper<nivalis::Plotter>,void>
              (&local_48,anon_unknown.dwarf_10d73::draw_worker,&local_38);
    std::thread::detach();
    while( true ) {
      iVar3 = glfwWindowShouldClose((anonymous_namespace)::window);
      if (iVar3 != 0) break;
      anon_unknown.dwarf_10d73::main_loop_step();
    }
    (anonymous_namespace)::run_worker_flag = 1;
    (anonymous_namespace)::worker_quit_flag = 1;
    std::condition_variable::notify_one();
    ImGui_ImplOpenGL3_Shutdown();
    ImGui_ImplGlfw_Shutdown();
    ImGui::DestroyContext((ImGuiContext *)0x0);
    glfwDestroyWindow((anonymous_namespace)::window);
    if (local_48._M_id._M_thread != 0) {
      std::terminate();
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int argc, char ** argv) {
    using namespace nivalis;
    for (int i = 1; i < argc; ++i) {
        if (i > 1) plot.add_func();
        // Load the expression
        plot.funcs[i - 1].expr_str = argv[i];
        plot.reparse_expr(i - 1);
    }
    if (!init_gl()) return 1; // GL initialization failed

    // Setup Dear ImGUI context
    IMGUI_CHECKVERSION();
    ImGui::CreateContext();
    ImGuiIO& io = ImGui::GetIO();
    font_sm = io.Fonts->AddFontFromMemoryCompressedTTF(ROBOTO_compressed_data,
            ROBOTO_compressed_size, 16.0f, NULL, GetGlyphRangesGreek());
    font_md = io.Fonts->AddFontFromMemoryCompressedTTF(ROBOTO_compressed_data,
            ROBOTO_compressed_size, 18.0f, NULL);

    // Setup Platform/Renderer bindings
    ImGui_ImplGlfw_InitForOpenGL(window, true);
    char* glsl_version = NULL;
    ImGui_ImplOpenGL3_Init(glsl_version);
    // Setup Dear ImGui style
    ImGui::StyleColorsLight();
    ImGuiStyle& style = ImGui::GetStyle();
    style.WindowRounding = 0.;
    style.WindowBorderSize = 1.;
    style.FrameBorderSize = 0.;
    style.Colors[ImGuiCol_Border]         = ImVec4(0.8f, 0.8f, 0.8f, 1.f);
    style.Colors[ImGuiCol_BorderShadow]   = ImVec4(0.f, 0.f, 0.f, 0.f);
    style.Colors[ImGuiCol_TitleBg]        = ImVec4(0.75f, 0.75f, 0.75f, 1.0f);
    style.Colors[ImGuiCol_TitleBgActive]    = ImVec4(0.7f, 0.7f, 0.7f, 1.f);
    style.Colors[ImGuiCol_TitleBgCollapsed] = ImVec4(0.75, 0.75f, 0.75f, 1.f);
    style.Colors[ImGuiCol_WindowBg]       = ImVec4(0.99f, 0.99f, 0.99f, 1.f);
    style.Colors[ImGuiCol_FrameBg]       = ImVec4(0.94f, 0.94f, 0.94f, 1.f);

    // Start worker thread
    std::thread thd(draw_worker, std::ref(plot));
    thd.detach();

    // Main GLFW loop (desktop)
    while (!glfwWindowShouldClose(window)) {
        main_loop_step();
    } // Main loop
    // Cleanup
    run_worker_flag = true;
    worker_quit_flag = true;
    worker_cv.notify_one();
    ImGui_ImplOpenGL3_Shutdown();
    ImGui_ImplGlfw_Shutdown();
    ImGui::DestroyContext();
    glfwDestroyWindow(window);
}